

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O2

ssize_t __thiscall cppwinrt::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  ConstantType CVar1;
  int value;
  uint value_00;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  invalid_argument *this_00;
  undefined4 in_register_00000034;
  Constant *this_01;
  
  this_01 = (Constant *)CONCAT44(in_register_00000034,__fd);
  CVar1 = winmd::reader::Constant::Type(this_01);
  if (CVar1 == UInt32) {
    value_00 = winmd::reader::Constant::ValueUInt32(this_01);
    write_value(this,value_00);
    return extraout_RAX_00;
  }
  if (CVar1 == Int32) {
    value = winmd::reader::Constant::ValueInt32(this_01);
    write_value(this,value);
    return extraout_RAX;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Unexpected constant type");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void write(Constant const& value)
        {
            switch (value.Type())
            {
            case ConstantType::Int32:
                write_value(value.ValueInt32());
                break;
            case ConstantType::UInt32:
                write_value(value.ValueUInt32());
                break;
            default:
                throw std::invalid_argument("Unexpected constant type");
            }
        }